

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O0

void format_message(char *msg,unsigned_long options)

{
  ulong in_RSI;
  char *in_RDI;
  bool bVar1;
  char *sp;
  char *start;
  int line_wid;
  char *p;
  char *local_30;
  char *local_28;
  char *local_18;
  
  if ((in_RSI & 1) == 0) {
    CTcHostIfc::print_err(G_hostifc,"%s",in_RDI);
  }
  else {
    CTcHostIfc::print_err(G_hostifc,"\n");
    local_18 = in_RDI;
    while (*local_18 != '\0') {
      local_30 = (char *)0x0;
      local_28 = local_18;
      while( true ) {
        while( true ) {
          if (*local_18 == ' ') {
            local_30 = local_18;
          }
          if ((*local_18 == '\0') ||
             ((0x4e < (long)local_18 - (long)local_28 && (local_30 != (char *)0x0)))) break;
          local_18 = local_18 + 1;
        }
        if (*local_18 == '\0') {
          local_30 = local_18;
        }
        while( true ) {
          bVar1 = false;
          if (local_28 < local_30) {
            bVar1 = local_30[-1] == ' ';
          }
          if (!bVar1) break;
          local_30 = local_30 + -1;
        }
        CTcHostIfc::print_err(G_hostifc,"%.*s\n",(long)local_30 - (long)local_28,local_28);
        for (; *local_30 == ' '; local_30 = local_30 + 1) {
        }
        if (*local_18 == '\0') break;
        local_18 = local_30;
        local_28 = local_30;
      }
    }
  }
  return;
}

Assistant:

static void format_message(const char *msg, unsigned long options)
{
    /*
     *   if we're in verbose mode, word-wrap to 80 columns; otherwise just
     *   print it as-is 
     */
    if ((options & TCMAIN_ERR_VERBOSE) != 0)
    {
        const char *p;
        const int line_wid = 79;

        /* start on a new line, to skip any prefix text */
        G_hostifc->print_err("\n");

        /* word-wrap to 80 columns */
        for (p = msg ; *p != '\0' ; )
        {
            const char *start;
            const char *sp;

            /* find the next word break */
            for (sp = 0, start = p ; ; )
            {
                /* if this is a space, note it */
                if (*p == ' ')
                    sp = p;

                /* 
                 *   if we're at the end of the line, or we're over the line
                 *   width and we found a space, break here 
                 */
                if (*p == '\0' || (p - start >= line_wid && sp != 0))
                {
                    /* if we've reached the end, print the rest */
                    if (*p == '\0')
                        sp = p;

                    /* trim off trailing spaces */
                    for ( ; sp > start && *(sp-1) == ' ' ; --sp) ;

                    /* show this part */
                    G_hostifc->print_err("%.*s\n", sp - start, start);

                    /* skip leading spaces */
                    for ( ; *sp == ' ' ; ++sp) ;

                    /* if this is the end of the line, we're done */
                    if (*p == '\0')
                        break;

                    /* start over here */
                    start = p = sp;
                }
                else
                {
                    /* this one fits - skip it */
                    ++p;
                }
            }
        }
    }
    else
    {
        /* display it */
        G_hostifc->print_err("%s", msg);
    }
}